

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.cpp
# Opt level: O0

void * __thiscall CRingBufferBase::Allocate(CRingBufferBase *this,int Size)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  CItem *pCVar5;
  int in_ESI;
  CRingBufferBase *in_RDI;
  CItem *pNewItem;
  CItem *pBlock;
  int WantedSize;
  CRingBufferBase *in_stack_ffffffffffffffd8;
  CItem *local_20;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ESI + 0x2f;
  iVar2 = SUB164(auVar1 / ZEXT816(0x18),0);
  iVar3 = iVar2 * 0x18;
  local_20 = (CItem *)0x0;
  if (iVar3 <= in_RDI->m_Size) {
    do {
      if (in_RDI->m_pProduce->m_Free != 0) {
        if (in_RDI->m_pProduce->m_Size < iVar3) {
          if ((in_RDI->m_pFirst->m_Free != 0) && (iVar3 <= in_RDI->m_pFirst->m_Size)) {
            local_20 = in_RDI->m_pFirst;
          }
        }
        else {
          local_20 = in_RDI->m_pProduce;
        }
      }
      if (local_20 != (CItem *)0x0) {
        if (iVar3 + 0x18 < local_20->m_Size) {
          pCVar5 = (CItem *)((long)&local_20->m_pPrev + (long)iVar3);
          pCVar5->m_pPrev = local_20;
          pCVar5->m_pNext = local_20->m_pNext;
          if (pCVar5->m_pNext != (CItem *)0x0) {
            pCVar5->m_pNext->m_pPrev = pCVar5;
          }
          local_20->m_pNext = pCVar5;
          pCVar5->m_Free = 1;
          pCVar5->m_Size = local_20->m_Size + iVar2 * -0x18;
          local_20->m_Size = iVar3;
          if (pCVar5->m_pNext == (CItem *)0x0) {
            in_RDI->m_pLast = pCVar5;
          }
        }
        pCVar5 = NextBlock(in_RDI,local_20);
        in_RDI->m_pProduce = pCVar5;
        local_20->m_Free = 0;
        return local_20 + 1;
      }
      if ((in_RDI->m_Flags & 1U) == 0) {
        return (void *)0x0;
      }
      iVar4 = PopFirst(in_stack_ffffffffffffffd8);
    } while (iVar4 != 0);
  }
  return (void *)0x0;
}

Assistant:

void *CRingBufferBase::Allocate(int Size)
{
	int WantedSize = (Size+sizeof(CItem)+sizeof(CItem)-1)/sizeof(CItem)*sizeof(CItem);
	CItem *pBlock = 0;

	// check if we even can fit this block
	if(WantedSize > m_Size)
		return 0;

	while(1)
	{
		// check for space
		if(m_pProduce->m_Free)
		{
			if(m_pProduce->m_Size >= WantedSize)
				pBlock = m_pProduce;
			else
			{
				// wrap around to try to find a block
				if(m_pFirst->m_Free && m_pFirst->m_Size >= WantedSize)
					pBlock = m_pFirst;
			}
		}

		if(pBlock)
			break;
		else
		{
			// we have no block, check our policy and see what todo
			if(m_Flags&FLAG_RECYCLE)
			{
				if(!PopFirst())
					return 0;
			}
			else
				return 0;
		}
	}

	// okey, we have our block

	// split the block if needed
	if(pBlock->m_Size > WantedSize+(int)sizeof(CItem))
	{
		CItem *pNewItem = (CItem *)((char *)pBlock + WantedSize);
		pNewItem->m_pPrev = pBlock;
		pNewItem->m_pNext = pBlock->m_pNext;
		if(pNewItem->m_pNext)
			pNewItem->m_pNext->m_pPrev = pNewItem;
		pBlock->m_pNext = pNewItem;

		pNewItem->m_Free = 1;
		pNewItem->m_Size = pBlock->m_Size - WantedSize;
		pBlock->m_Size = WantedSize;

		if(!pNewItem->m_pNext)
			m_pLast = pNewItem;
	}


	// set next block
	m_pProduce = NextBlock(pBlock);

	// set as used and return the item pointer
	pBlock->m_Free = 0;
	return (void *)(pBlock+1);
}